

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O0

void __thiscall deqp::egl::ApiCase::expectNoSurface(ApiCase *this,EGLSurface got)

{
  qpTestResult qVar1;
  TestLog *this_00;
  MessageBuilder *this_01;
  EGLDisplay dpy;
  MessageBuilder local_198;
  EGLSurface local_18;
  EGLSurface got_local;
  ApiCase *this_local;
  
  if (got != (EGLSurface)0x0) {
    local_18 = got;
    got_local = this;
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_198,(char (*) [34])"// ERROR expected: EGL_NO_SURFACE");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid value");
    }
    dpy = getDisplay(this);
    eglu::CallLogWrapper::eglDestroySurface(&this->super_CallLogWrapper,dpy,local_18);
  }
  return;
}

Assistant:

void ApiCase::expectNoSurface (EGLSurface got)
{
	if (got != EGL_NO_SURFACE)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: EGL_NO_SURFACE" << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
		eglDestroySurface(getDisplay(), got);
	}
}